

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesQueueBindSparseTests.cpp
# Opt level: O2

void vkt::sparse::anon_unknown_2::populateTestGroup(TestCaseGroup *group)

{
  TestContext *pTVar1;
  TestNode *node;
  string *description;
  long lVar2;
  bool bVar3;
  allocator<char> local_5fc;
  allocator<char> local_5fb;
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  allocator<char> local_5f8;
  allocator<char> local_5f7;
  allocator<char> local_5f6;
  allocator<char> local_5f5;
  allocator<char> local_5f4;
  allocator<char> local_5f3;
  allocator<char> local_5f2;
  allocator<char> local_5f1;
  allocator<char> local_5f0;
  allocator<char> local_5ef;
  allocator<char> local_5ee;
  allocator<char> local_5ed;
  allocator<char> local_5ec;
  allocator<char> local_5eb;
  allocator<char> local_5ea;
  allocator<char> local_5e9;
  allocator<char> local_5e8;
  allocator<char> local_5e7;
  allocator<char> local_5e6;
  allocator<char> local_5e5;
  allocator<char> local_5e4;
  allocator<char> local_5e3;
  allocator<char> local_5e2;
  allocator<char> local_5e1;
  allocator<char> local_5e0;
  allocator<char> local_5df;
  allocator<char> local_5de;
  allocator<char> local_5dd;
  allocator<char> local_5dc;
  allocator<char> local_5db;
  allocator<char> local_5da;
  allocator<char> local_5d9;
  string local_5d8 [32];
  undefined4 local_5b8;
  undefined8 uStack_5b4;
  undefined2 uStack_5ac;
  string local_5a8;
  string local_588 [32];
  undefined4 local_568;
  undefined8 local_564;
  undefined2 local_55c;
  string local_558 [32];
  string local_538 [32];
  undefined8 local_518;
  undefined4 local_510;
  undefined2 local_50c;
  string local_508 [32];
  string local_4e8 [32];
  undefined8 local_4c8;
  undefined4 local_4c0;
  undefined2 local_4bc;
  string local_4b8 [32];
  string local_498 [32];
  undefined8 local_478;
  undefined4 local_470;
  undefined2 local_46c;
  string local_468 [32];
  string local_448 [32];
  undefined8 local_428;
  undefined4 local_420;
  undefined2 local_41c;
  string local_418 [32];
  string local_3f8 [32];
  undefined8 local_3d8;
  undefined4 local_3d0;
  undefined2 local_3cc;
  string local_3c8 [32];
  string local_3a8 [32];
  undefined8 local_388;
  undefined4 local_380;
  undefined2 local_37c;
  string local_378 [32];
  string local_358 [32];
  undefined8 local_338;
  undefined4 local_330;
  undefined2 local_32c;
  string local_328 [32];
  string local_308 [32];
  undefined1 *local_2e8;
  undefined4 local_2e0;
  undefined2 local_2dc;
  string local_2d8 [32];
  string local_2b8 [32];
  undefined8 local_298;
  undefined4 local_290;
  undefined2 local_28c;
  string local_288 [32];
  string local_268 [32];
  undefined8 local_248;
  undefined4 local_240;
  undefined2 local_23c;
  string local_238 [32];
  string local_218 [32];
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined2 local_1ec;
  string local_1e8 [32];
  string local_1c8 [32];
  undefined1 *local_1a8;
  undefined4 local_1a0;
  undefined2 local_19c;
  string local_198 [32];
  string local_178 [32];
  undefined8 local_158;
  undefined4 local_150;
  undefined2 local_14c;
  string local_148 [32];
  string local_128 [32];
  undefined8 local_108;
  undefined4 local_100;
  undefined2 local_fc;
  string local_f8 [32];
  string local_d8 [32];
  undefined8 local_b8;
  undefined4 local_b0;
  undefined2 local_ac;
  string local_a8 [32];
  string local_88 [32];
  undefined8 local_68;
  undefined4 local_60;
  undefined2 local_5c;
  string local_58 [40];
  
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"no_dependency",&local_5d9);
  description = &local_5a8;
  local_5b8 = 1;
  uStack_5b4 = 0;
  uStack_5ac = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)description,"submit without any semaphores",&local_5da);
  std::__cxx11::string::string<std::allocator<char>>(local_588,"no_dependency_fence",&local_5db);
  local_568 = 1;
  local_564 = 0;
  local_55c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,"submit without any semaphores, signal a fence",&local_5dc);
  std::__cxx11::string::string<std::allocator<char>>(local_538,"single_queue_wait_one",&local_5dd);
  local_518 = 0x100000001;
  local_510 = 0;
  local_50c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_508,"only sparse queue, wait for semaphore(s)",&local_5de);
  std::__cxx11::string::string<std::allocator<char>>(local_4e8,"single_queue_wait_many",&local_5df);
  local_4c8 = 0x300000001;
  local_4c0 = 0;
  local_4bc = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b8,"only sparse queue, wait for semaphore(s)",&local_5e0);
  std::__cxx11::string::string<std::allocator<char>>(local_498,"single_queue_signal_one",&local_5e1)
  ;
  local_478 = 1;
  local_470 = 1;
  local_46c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_468,"only sparse queue, signal semaphore(s)",&local_5e2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_448,"single_queue_signal_many",&local_5e3);
  local_428 = 1;
  local_420 = 3;
  local_41c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"only sparse queue, signal semaphore(s)",&local_5e4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,"single_queue_wait_one_signal_one",&local_5e5);
  local_3d8 = 0x100000001;
  local_3d0 = 1;
  local_3cc = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c8,"only sparse queue, wait for and signal semaphore(s)",&local_5e6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a8,"single_queue_wait_many_signal_many",&local_5e7);
  local_388 = 0x200000001;
  local_380 = 3;
  local_37c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,"only sparse queue, wait for and signal semaphore(s)",&local_5e8);
  std::__cxx11::string::string<std::allocator<char>>(local_358,"multi_queue_wait_one",&local_5e9);
  local_338 = 0x100000002;
  local_330 = 0;
  local_32c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"sparse and other queues, wait for semaphore(s)",&local_5ea);
  std::__cxx11::string::string<std::allocator<char>>(local_308,"multi_queue_wait_many",&local_5eb);
  local_2e8 = &DAT_200000002;
  local_2e0 = 0;
  local_2dc = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,"sparse and other queues, wait for semaphore(s)",&local_5ec);
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"multi_queue_signal_one",&local_5ed);
  local_298 = 2;
  local_290 = 1;
  local_28c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_288,"sparse and other queues, signal semaphore(s)",&local_5ee);
  std::__cxx11::string::string<std::allocator<char>>(local_268,"multi_queue_signal_many",&local_5ef)
  ;
  local_248 = 2;
  local_240 = 2;
  local_23c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"sparse and other queues, signal semaphore(s)",&local_5f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"multi_queue_wait_one_signal_one",&local_5f1);
  local_1f8 = 0x100000002;
  local_1f0 = 1;
  local_1ec = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"sparse and other queues, wait for and signal semaphore(s)",&local_5f2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c8,"multi_queue_wait_many_signal_many",&local_5f3);
  local_1a8 = &DAT_200000002;
  local_1a0 = 2;
  local_19c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"sparse and other queues, wait for and signal semaphore(s)",&local_5f4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"multi_queue_wait_one_signal_one_other",&local_5f5);
  local_158 = 0x100000002;
  local_150 = 1;
  local_14c = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"sparse and other queues, wait for and signal semaphore(s) on other queues",
             &local_5f6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"multi_queue_wait_many_signal_many_other",&local_5f7);
  local_108 = 0x200000003;
  local_100 = 2;
  local_fc = 0x100;
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"sparse and other queues, wait for and signal semaphore(s) on other queues",
             &local_5f8);
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"empty",&local_5f9);
  local_b8 = 1;
  local_b0 = 0;
  local_ac = 1;
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"call vkQueueBindSparse with zero bindInfos",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_88,"empty_fence",&local_5fb);
  local_68 = 1;
  local_60 = 0;
  local_5c = 0x101;
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"call vkQueueBindSparse with zero bindInfos, signal a fence",&local_5fc);
  lVar2 = 0x12;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    node = (TestNode *)operator_new(0x80);
    TestCase::TestCase((TestCase *)node,(group->super_TestNode).m_testCtx,
                       (string *)&description[-2].field_2,description);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c07ad0;
    pTVar1 = *(TestContext **)((long)&description[-1].field_2 + 8);
    node[1]._vptr_TestNode = (_func_int **)description[-1].field_2._M_allocated_capacity;
    node[1].m_testCtx = pTVar1;
    tcu::TestNode::addChild(&group->super_TestNode,node);
    description = (string *)&description[2].field_2;
  }
  lVar2 = 0x550;
  do {
    sparse::(anonymous_namespace)::populateTestGroup(tcu::TestCaseGroup*)::$_0::~__0
              ((__0 *)(local_5d8 + lVar2));
    lVar2 = lVar2 + -0x50;
  } while (lVar2 != -0x50);
  return;
}

Assistant:

void populateTestGroup(tcu::TestCaseGroup* group)
{
	const struct
	{
		std::string		name;
		TestParams		params;
		std::string		description;
	} cases[] =
	{
		// case name									// numQueues, numWaitSems, numSignalSems, emptySubmission, checkFence
		{ "no_dependency",								{	1u,	0u,	0u,	false,	false,	}, "submit without any semaphores", },
		{ "no_dependency_fence",						{	1u,	0u,	0u,	false,	true,	}, "submit without any semaphores, signal a fence", },

		{ "single_queue_wait_one",						{	1u,	1u,	0u,	false,	true,	}, "only sparse queue, wait for semaphore(s)", },
		{ "single_queue_wait_many",						{	1u,	3u,	0u,	false,	true,	}, "only sparse queue, wait for semaphore(s)", },
		{ "single_queue_signal_one",					{	1u,	0u,	1u,	false,	true,	}, "only sparse queue, signal semaphore(s)", },
		{ "single_queue_signal_many",					{	1u,	0u,	3u,	false,	true,	}, "only sparse queue, signal semaphore(s)", },
		{ "single_queue_wait_one_signal_one",			{	1u,	1u,	1u,	false,	true,	}, "only sparse queue, wait for and signal semaphore(s)", },
		{ "single_queue_wait_many_signal_many",			{	1u,	2u,	3u,	false,	true,	}, "only sparse queue, wait for and signal semaphore(s)", },

		{ "multi_queue_wait_one",						{	2u,	1u,	0u,	false,	true,	}, "sparse and other queues, wait for semaphore(s)", },
		{ "multi_queue_wait_many",						{	2u,	2u,	0u,	false,	true,	}, "sparse and other queues, wait for semaphore(s)", },
		{ "multi_queue_signal_one",						{	2u,	0u,	1u,	false,	true,	}, "sparse and other queues, signal semaphore(s)", },
		{ "multi_queue_signal_many",					{	2u,	0u,	2u,	false,	true,	}, "sparse and other queues, signal semaphore(s)", },
		{ "multi_queue_wait_one_signal_one",			{	2u,	1u,	1u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s)", },
		{ "multi_queue_wait_many_signal_many",			{	2u,	2u,	2u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s)", },
		{ "multi_queue_wait_one_signal_one_other",		{	2u,	1u,	1u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s) on other queues", },
		{ "multi_queue_wait_many_signal_many_other",	{	3u,	2u,	2u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s) on other queues", },

		{ "empty",										{	1u,	0u,	0u,	true,	false,	}, "call vkQueueBindSparse with zero bindInfos", },
		{ "empty_fence",								{	1u,	0u,	0u,	true,	true,	}, "call vkQueueBindSparse with zero bindInfos, signal a fence", },
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
		group->addChild(new SparseQueueBindTest(group->getTestContext(), cases[caseNdx].name, cases[caseNdx].description, cases[caseNdx].params));
}